

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::moveFromSpan
          (Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *this,
          Span<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node> *fromSpan,size_t fromIndex,
          size_t to)

{
  Entry *pEVar1;
  uchar *this_00;
  byte bVar2;
  Key KVar3;
  
  if (this->nextFree == this->allocated) {
    addStorage(this);
  }
  this->offsets[to] = this->nextFree;
  pEVar1 = this->entries + this->nextFree;
  this->nextFree = (pEVar1->storage).data[0];
  bVar2 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  this_00 = fromSpan->entries[bVar2].storage.data + 0x10;
  KVar3.d = *(KeyData **)(this_00 + -8);
  *(KeyData **)(pEVar1->storage).data =
       *(KeyData **)((anon_struct_40_1_898a9ca8_for_storage *)(this_00 + -0x10))->data;
  *(KeyData **)((pEVar1->storage).data + 8) = KVar3.d;
  KVar3.d = *(KeyData **)(this_00 + 8);
  *(KeyData **)((pEVar1->storage).data + 0x10) = *(KeyData **)this_00;
  *(KeyData **)((pEVar1->storage).data + 0x18) = KVar3.d;
  *(KeyData **)this_00 = (KeyData *)0x0;
  *(KeyData **)((pEVar1->storage).data + 0x20) = *(KeyData **)(this_00 + 0x10);
  *(KeyData **)(this_00 + 8) = (KeyData *)0x0;
  *(Entry **)(*(long *)(pEVar1->storage).data + 8) = pEVar1;
  **(long **)((pEVar1->storage).data + 8) = (long)pEVar1;
  QPixmapCache::Key::~Key((Key *)this_00);
  ((anon_struct_40_1_898a9ca8_for_storage *)(this_00 + -0x10))->data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar2;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }